

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_to_revision.cpp
# Opt level: O0

maybe<unsigned_int,_void> *
pstore::str_to_revision(maybe<unsigned_int,_void> *__return_storage_ptr__,string *str)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint *value;
  uint local_64;
  ulong local_60;
  long revision;
  char *endptr;
  czstring cstr;
  anon_unknown_dwarf_ed85d local_38 [8];
  string arg;
  string *str_local;
  
  anon_unknown.dwarf_ed85d::trim_and_lowercase(local_38,str);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"head");
  if (bVar1) {
    just<unsigned_int_const&>(__return_storage_ptr__,(pstore *)&head_revision,value);
  }
  else {
    endptr = (char *)std::__cxx11::string::c_str();
    revision = 0;
    uVar3 = strtol(endptr,(char **)&revision,10);
    local_60 = uVar3;
    if (((((char *)revision != endptr) && (*(char *)revision == '\0')) &&
        (uVar3 != 0x7fffffffffffffff)) &&
       (((uVar3 != 0x8000000000000000 && (-1 < (long)uVar3)) && (uVar3 != 0xffffffff)))) {
      uVar2 = std::numeric_limits<unsigned_int>::max();
      if (uVar3 < uVar2) {
        local_64 = (uint)local_60;
        just<unsigned_int>(__return_storage_ptr__,&local_64);
        goto LAB_001546c0;
      }
    }
    nothing<unsigned_int>();
  }
LAB_001546c0:
  cstr._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

maybe<unsigned> str_to_revision (std::string const & str) {
        std::string const arg = trim_and_lowercase (str);
        if (arg == "head") {
            return just (head_revision);
        }

        gsl::czstring const cstr = arg.c_str ();
        char * endptr = nullptr;
        long const revision = std::strtol (cstr, &endptr, 10);

        // strtol() returns LONG_MAX or LONG_MIN to indicate an overflow. endptr must point to
        // the terminating null character to ensure that the entire string was consumed. We also
        // check that revision lies within the range of numbers that we can safely represent.
        if (endptr != cstr && *endptr == '\0' && revision != LONG_MAX && revision != LONG_MIN &&
            revision >= 0 && revision != head_revision &&
            static_cast<unsigned long> (revision) < std::numeric_limits<unsigned>::max ()) {

            return just (static_cast<unsigned> (revision));
        }

        return nothing<unsigned> ();
    }